

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_do_write_interlace(png_row_infop row_info,png_bytep row,int pass)

{
  png_byte pVar1;
  uint uVar2;
  size_t __n;
  ulong local_c8;
  size_t pixel_bytes;
  png_uint_32 row_width_3;
  png_uint_32 i_3;
  png_bytep dp_3;
  png_bytep sp_3;
  uint local_90;
  png_uint_32 row_width_2;
  png_uint_32 i_2;
  int value_2;
  int d_2;
  uint shift_2;
  png_bytep dp_2;
  png_bytep sp_2;
  uint local_68;
  png_uint_32 row_width_1;
  png_uint_32 i_1;
  int value_1;
  int d_1;
  uint shift_1;
  png_bytep dp_1;
  png_bytep sp_1;
  uint local_40;
  png_uint_32 row_width;
  png_uint_32 i;
  int value;
  int d;
  uint shift;
  png_bytep dp;
  png_bytep sp;
  int pass_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if (pass < 6) {
    pVar1 = row_info->pixel_depth;
    if (pVar1 == '\x01') {
      uVar2 = row_info->width;
      i = 0;
      value = 7;
      _d = row;
      for (local_40 = (uint)""[pass]; local_40 < uVar2;
          local_40 = "\b\b\x04\x04\x02\x02\x01"[pass] + local_40) {
        i = ((int)(uint)row[local_40 >> 3] >> (7 - ((byte)local_40 & 7) & 0x1f) & 1U) <<
            ((byte)value & 0x1f) | i;
        if (value == 0) {
          value = 7;
          *_d = (png_byte)i;
          i = 0;
          _d = _d + 1;
        }
        else {
          value = value + -1;
        }
      }
      if (value != 7) {
        *_d = (png_byte)i;
      }
    }
    else if (pVar1 == '\x02') {
      uVar2 = row_info->width;
      value_1 = 6;
      i_1 = 0;
      _d_1 = row;
      for (local_68 = (uint)""[pass]; local_68 < uVar2;
          local_68 = "\b\b\x04\x04\x02\x02\x01"[pass] + local_68) {
        i_1 = ((int)(uint)row[local_68 >> 2] >> (('\x03' - ((byte)local_68 & 3)) * '\x02' & 0x1f) &
              3U) << ((byte)value_1 & 0x1f) | i_1;
        if (value_1 == 0) {
          value_1 = 6;
          *_d_1 = (png_byte)i_1;
          i_1 = 0;
          _d_1 = _d_1 + 1;
        }
        else {
          value_1 = value_1 + -2;
        }
      }
      if (value_1 != 6) {
        *_d_1 = (png_byte)i_1;
      }
    }
    else if (pVar1 == '\x04') {
      uVar2 = row_info->width;
      value_2 = 4;
      i_2 = 0;
      _d_2 = row;
      for (local_90 = (uint)""[pass]; local_90 < uVar2;
          local_90 = "\b\b\x04\x04\x02\x02\x01"[pass] + local_90) {
        i_2 = ((int)(uint)row[local_90 >> 1] >> (('\x01' - ((byte)local_90 & 1)) * '\x04' & 0x1f) &
              0xfU) << ((byte)value_2 & 0x1f) | i_2;
        if (value_2 == 0) {
          value_2 = 4;
          *_d_2 = (png_byte)i_2;
          i_2 = 0;
          _d_2 = _d_2 + 1;
        }
        else {
          value_2 = value_2 + -4;
        }
      }
      if (value_2 != 4) {
        *_d_2 = (png_byte)i_2;
      }
    }
    else {
      uVar2 = row_info->width;
      __n = (size_t)((int)(uint)row_info->pixel_depth >> 3);
      _row_width_3 = row;
      for (pixel_bytes._4_4_ = (uint)""[pass]; pixel_bytes._4_4_ < uVar2;
          pixel_bytes._4_4_ = "\b\b\x04\x04\x02\x02\x01"[pass] + pixel_bytes._4_4_) {
        if (_row_width_3 != row + pixel_bytes._4_4_ * __n) {
          memcpy(_row_width_3,row + pixel_bytes._4_4_ * __n,__n);
        }
        _row_width_3 = _row_width_3 + __n;
      }
    }
    row_info->width =
         ((row_info->width + (uint)"\b\b\x04\x04\x02\x02\x01"[pass] + -1) - (uint)""[pass]) /
         (uint)"\b\b\x04\x04\x02\x02\x01"[pass];
    if (row_info->pixel_depth < 8) {
      local_c8 = (ulong)row_info->width * (ulong)row_info->pixel_depth + 7 >> 3;
    }
    else {
      local_c8 = (ulong)row_info->width * (ulong)(row_info->pixel_depth >> 3);
    }
    row_info->rowbytes = local_c8;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_write_interlace(png_row_infop row_info, png_bytep row, int pass)
{
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */

   /* Start of interlace block */
   static const png_byte png_pass_start[7] = {0, 4, 0, 2, 0, 1, 0};

   /* Offset to next interlace block */
   static const png_byte png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   png_debug(1, "in png_do_write_interlace");

   /* We don't have to do anything on the last pass (6) */
   if (pass < 6)
   {
      /* Each pixel depth is handled separately */
      switch (row_info->pixel_depth)
      {
         case 1:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            d = 0;
            shift = 7;

            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 3);
               value = (int)(*sp >> (7 - (int)(i & 0x07))) & 0x01;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 7;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift--;

            }
            if (shift != 7)
               *dp = (png_byte)d;

            break;
         }

         case 2:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            shift = 6;
            d = 0;

            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 2);
               value = (*sp >> ((3 - (int)(i & 0x03)) << 1)) & 0x03;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 6;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift -= 2;
            }
            if (shift != 6)
               *dp = (png_byte)d;

            break;
         }

         case 4:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            shift = 4;
            d = 0;
            for (i = png_pass_start[pass]; i < row_width;
                i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 1);
               value = (*sp >> ((1 - (int)(i & 0x01)) << 2)) & 0x0f;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 4;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift -= 4;
            }
            if (shift != 4)
               *dp = (png_byte)d;

            break;
         }

         default:
         {
            png_bytep sp;
            png_bytep dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;
            size_t pixel_bytes;

            /* Start at the beginning */
            dp = row;

            /* Find out how many bytes each pixel takes up */
            pixel_bytes = (row_info->pixel_depth >> 3);

            /* Loop through the row, only looking at the pixels that matter */
            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               /* Find out where the original pixel is */
               sp = row + (size_t)i * pixel_bytes;

               /* Move the pixel */
               if (dp != sp)
                  memcpy(dp, sp, pixel_bytes);

               /* Next pixel */
               dp += pixel_bytes;
            }
            break;
         }
      }
      /* Set new row width */
      row_info->width = (row_info->width +
          png_pass_inc[pass] - 1 -
          png_pass_start[pass]) /
          png_pass_inc[pass];

      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth,
          row_info->width);
   }
}